

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.h
# Opt level: O3

void __thiscall Assimp::ASE::BaseNode::BaseNode(BaseNode *this,Type _mType,string *name)

{
  pointer pcVar1;
  
  this->mType = _mType;
  (this->mName)._M_dataplus._M_p = (pointer)&(this->mName).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mName,pcVar1,pcVar1 + name->_M_string_length);
  (this->mParent)._M_dataplus._M_p = (pointer)&(this->mParent).field_2;
  (this->mParent)._M_string_length = 0;
  (this->mParent).field_2._M_local_buf[0] = '\0';
  (this->mTransform).a1 = 1.0;
  (this->mTransform).a2 = 0.0;
  (this->mTransform).a3 = 0.0;
  (this->mTransform).a4 = 0.0;
  (this->mTransform).b1 = 0.0;
  (this->mTransform).b2 = 1.0;
  (this->mTransform).b3 = 0.0;
  (this->mTransform).b4 = 0.0;
  (this->mTransform).c1 = 0.0;
  (this->mTransform).c2 = 0.0;
  (this->mTransform).c3 = 1.0;
  (this->mTransform).c4 = 0.0;
  (this->mTransform).d1 = 0.0;
  (this->mTransform).d2 = 0.0;
  (this->mTransform).d3 = 0.0;
  (this->inherit).abInheritPosition[0] = true;
  (this->inherit).abInheritPosition[1] = true;
  (this->inherit).abInheritPosition[2] = true;
  (this->inherit).abInheritRotation[0] = true;
  (this->inherit).abInheritRotation[1] = true;
  (this->inherit).abInheritRotation[2] = true;
  (this->inherit).abInheritScaling[0] = true;
  (this->inherit).abInheritScaling[1] = true;
  (this->inherit).abInheritScaling[2] = true;
  (this->mAnim).mRotationType = TRACK;
  (this->mAnim).mScalingType = TRACK;
  (this->mAnim).mPositionType = TRACK;
  (this->mAnim).akeyRotations.super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mAnim).akeyRotations.super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mAnim).akeyRotations.super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mAnim).akeyPositions.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mAnim).akeyPositions.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mAnim).akeyPositions.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mAnim).akeyScaling.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mAnim).akeyScaling.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mAnim).akeyScaling.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mTargetAnim).mRotationType = TRACK;
  (this->mTargetAnim).mScalingType = TRACK;
  (this->mTargetAnim).mPositionType = TRACK;
  *(undefined8 *)
   ((long)&(this->mTargetAnim).akeyScaling.
           super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->mTargetAnim).akeyScaling.
           super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->mTargetAnim).akeyScaling.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mTargetAnim).akeyScaling.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mTargetAnim).akeyPositions.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mTargetAnim).akeyPositions.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mTargetAnim).akeyRotations.super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mTargetAnim).akeyPositions.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mTargetAnim).akeyRotations.super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mTargetAnim).akeyRotations.super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)&(this->mTransform).d4 = 0x7fc000003f800000;
  (this->mTargetPosition).y = 0.0;
  (this->mTargetPosition).z = 0.0;
  return;
}

Assistant:

BaseNode(Type _mType, const std::string &name)
    : mType         (_mType)
    , mName         (name)
    , mProcessed    (false) {
        // Set mTargetPosition to qnan
        const ai_real qnan = get_qnan();
        mTargetPosition.x = qnan;
    }